

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

s_level * get_next_elemental_plane(d_level *lev)

{
  boolean bVar1;
  s_level *local_28;
  s_level *plane;
  s_level *curr;
  d_level *lev_local;
  
  if (lev->dnum == dungeon_topology.d_astral_level.dnum) {
    find_level("astral");
    local_28 = (s_level *)0x0;
    for (plane = sp_levchn; plane != (s_level *)0x0; plane = plane->next) {
      bVar1 = on_level(lev,&plane->dlevel);
      if (bVar1 != '\0') {
        return local_28;
      }
      local_28 = plane;
    }
  }
  else {
    pline("get_next_elemental_plane not in Endgame.");
  }
  return (s_level *)0x0;
}

Assistant:

s_level *get_next_elemental_plane(const d_level *lev)
{
	if (!In_endgame(lev)) {
	    pline("get_next_elemental_plane not in Endgame.");
	    return NULL;
	}

	s_level *curr = find_level("astral"),
		*plane = NULL;
	for (curr = sp_levchn; curr; curr = curr->next) {
	    if (on_level(lev, &(curr->dlevel)))
		return plane;
	    plane = curr;
	}
	return NULL;
}